

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_NormalizeSignature_Test::~CryptoUtil_NormalizeSignature_Test
          (CryptoUtil_NormalizeSignature_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CryptoUtil, NormalizeSignature) {
  // FIXME(fujita-cg): replace test data
  // this test data comes from https://www.pebblewind.com/entry/2018/04/27/232427
  const ByteData expect_bytes(
      "c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee509809307e5e678cf6e55836a8705d16871a040ea369a21a427d2100a7d75deba");
  ByteData signature(
      "c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5f67f6cf81a19873091aa7c9578fa2e96490e9bfc78ae7e9798004e8252c06287");
  ByteData byte_data = CryptoUtil::NormalizeSignature(signature);
  // equals data on generate by libwally
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      expect_bytes.GetHex().c_str());
}